

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FileDescriptorTables *this_00;
  anon_union_8_8_13f84498_for_Symbol_2 aVar1;
  bool bVar2;
  Label LVar3;
  FieldDescriptorProto_Type FVar4;
  CppType CVar5;
  int iVar6;
  FieldOptions *pFVar7;
  OneofDescriptor *pOVar8;
  string *psVar9;
  GoogleOnceDynamic *pGVar10;
  EnumDescriptor *pEVar11;
  EnumDescriptor *pEVar12;
  EnumValueDescriptor *pEVar13;
  Descriptor *pDVar14;
  string *psVar15;
  FileDescriptor *this_01;
  Symbol SVar16;
  SubstituteArg *in_stack_fffffffffffff318;
  Tables *pTVar17;
  bool local_b29;
  SubstituteArg local_a90;
  SubstituteArg local_a60;
  SubstituteArg local_a30;
  SubstituteArg local_a00;
  SubstituteArg local_9d0;
  SubstituteArg local_9a0;
  SubstituteArg local_970;
  SubstituteArg local_940;
  SubstituteArg local_910;
  SubstituteArg local_8e0;
  undefined1 local_8b0 [8];
  string error_msg;
  FieldDescriptor *conflicting_field_1;
  SubstituteArg local_858;
  SubstituteArg local_828;
  SubstituteArg local_7f8;
  SubstituteArg local_7c8;
  SubstituteArg local_798;
  SubstituteArg local_768;
  SubstituteArg local_738;
  SubstituteArg local_708;
  SubstituteArg local_6d8;
  string local_6a8;
  SubstituteArg local_688;
  SubstituteArg local_658;
  SubstituteArg local_628;
  SubstituteArg local_5f8;
  SubstituteArg local_5c8;
  SubstituteArg local_598;
  SubstituteArg local_568;
  SubstituteArg local_538;
  SubstituteArg local_508;
  SubstituteArg local_4d8;
  string local_4a8;
  byte local_482;
  allocator<char> local_481;
  undefined1 local_480 [8];
  string containing_type_name;
  FieldDescriptor *conflicting_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  Type local_3d8;
  Symbol default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string name;
  string local_2e0;
  Type local_2c0;
  undefined4 uStack_2bc;
  anon_union_8_8_13f84498_for_Symbol_2 local_2b8;
  undefined1 local_2b0 [8];
  Symbol type;
  undefined1 local_298 [7];
  bool expecting_enum;
  SubstituteArg local_268;
  SubstituteArg local_238;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  string local_b8;
  ExtensionRange *local_98;
  ExtensionRange *extension_range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  Symbol extendee;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  extendee.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)proto;
  if (*(long *)(field + 0x80) == 0) {
    pFVar7 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x80) = pFVar7;
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  bVar2 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)extendee.field_1.descriptor);
  if (bVar2) {
    psVar9 = FieldDescriptorProto::extendee_abi_cxx11_
                       ((FieldDescriptorProto *)extendee.field_1.descriptor);
    psVar15 = FieldDescriptor::full_name_abi_cxx11_(field);
    SVar16 = LookupSymbol(this,psVar9,psVar15,PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true);
    extendee._0_8_ = SVar16.field_1;
    local_40._0_4_ = SVar16.type;
    bVar2 = Symbol::IsNull((Symbol *)local_40);
    if (bVar2) {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      psVar15 = FieldDescriptorProto::extendee_abi_cxx11_
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
      AddNotDefinedError(this,psVar9,(Message *)aVar1.descriptor,EXTENDEE,psVar15);
      return;
    }
    if (local_40._0_4_ != MESSAGE) {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      psVar15 = FieldDescriptorProto::extendee_abi_cxx11_
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
      std::operator+(&local_80,"\"",psVar15);
      std::operator+(&local_60,&local_80,"\" is not a message type.");
      AddError(this,psVar9,(Message *)aVar1.descriptor,EXTENDEE,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      return;
    }
    *(undefined8 *)(field + 0x58) = extendee._0_8_;
    pDVar14 = FieldDescriptor::containing_type(field);
    iVar6 = FieldDescriptor::number(field);
    local_98 = Descriptor::FindExtensionRangeContainingNumber(pDVar14,iVar6);
    if (local_98 == (ExtensionRange *)0x0) {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      pDVar14 = FieldDescriptor::containing_type(field);
      psVar15 = Descriptor::full_name_abi_cxx11_(pDVar14);
      strings::internal::SubstituteArg::SubstituteArg(&local_e8,psVar15);
      iVar6 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_118,iVar6);
      strings::internal::SubstituteArg::SubstituteArg(&local_148);
      strings::internal::SubstituteArg::SubstituteArg(&local_178);
      strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_208);
      strings::internal::SubstituteArg::SubstituteArg(&local_238);
      strings::internal::SubstituteArg::SubstituteArg(&local_268);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_298);
      strings::Substitute_abi_cxx11_
                (&local_b8,(strings *)"\"$0\" does not declare $1 as an extension number.",
                 (char *)&local_e8,&local_118,&local_148,&local_178,&local_1a8,&local_1d8,&local_208
                 ,&local_238,&local_268,(SubstituteArg *)local_298,in_stack_fffffffffffff318);
      AddError(this,psVar9,(Message *)aVar1.descriptor,NUMBER,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  pOVar8 = FieldDescriptor::containing_oneof(field);
  if ((pOVar8 != (OneofDescriptor *)0x0) &&
     (LVar3 = FieldDescriptor::label(field), LVar3 != LABEL_OPTIONAL)) {
    psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
    AddError(this,psVar9,(Message *)extendee.field_1.descriptor,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  bVar2 = FieldDescriptorProto::has_type_name((FieldDescriptorProto *)extendee.field_1.descriptor);
  if (bVar2) {
    FVar4 = FieldDescriptorProto::type((FieldDescriptorProto *)extendee.field_1.descriptor);
    local_b29 = true;
    if (FVar4 != FieldDescriptorProto_Type_TYPE_ENUM) {
      local_b29 = FieldDescriptorProto::has_default_value
                            ((FieldDescriptorProto *)extendee.field_1.descriptor);
    }
    type.field_1._7_1_ = local_b29;
    psVar9 = FieldDescriptorProto::type_name_abi_cxx11_
                       ((FieldDescriptorProto *)extendee.field_1.descriptor);
    psVar15 = FieldDescriptor::full_name_abi_cxx11_(field);
    SVar16 = LookupSymbol(this,psVar9,psVar15,(uint)((type.field_1._7_1_ & 1) != 0),LOOKUP_TYPES,
                          (bool)((this->pool_->lazily_build_dependencies_ ^ 0xffU) & 1));
    type._0_8_ = SVar16.field_1;
    local_2b0._0_4_ = SVar16.type;
    bVar2 = Symbol::IsNull((Symbol *)local_2b0);
    if ((bVar2) && ((this->pool_->enforce_weak_ & 1U) == 0)) {
      pFVar7 = FieldDescriptorProto::options((FieldDescriptorProto *)extendee.field_1.descriptor);
      bVar2 = FieldOptions::weak(pFVar7);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"google.protobuf.Empty",
                   (allocator<char> *)(name.field_2._M_local_buf + 0xf));
        SVar16 = FindSymbol(this,&local_2e0,true);
        local_2b8 = SVar16.field_1;
        local_2c0 = SVar16.type;
        local_2b0._4_4_ = uStack_2bc;
        local_2b0._0_4_ = local_2c0;
        type._0_8_ = local_2b8;
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      }
    }
    bVar2 = Symbol::IsNull((Symbol *)local_2b0);
    if (bVar2) {
      if ((this->pool_->lazily_build_dependencies_ & 1U) != 0) {
        psVar9 = FieldDescriptorProto::type_name_abi_cxx11_
                           ((FieldDescriptorProto *)extendee.field_1.descriptor);
        std::__cxx11::string::string((string *)local_308,(string *)psVar9);
        if ((this->pool_->enforce_weak_ & 1U) == 0) {
          pFVar7 = FieldDescriptorProto::options
                             ((FieldDescriptorProto *)extendee.field_1.descriptor);
          bVar2 = FieldOptions::weak(pFVar7);
          if (bVar2) {
            std::__cxx11::string::operator=((string *)local_308,"google.protobuf.Empty");
          }
        }
        pGVar10 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
        *(GoogleOnceDynamic **)(field + 0x40) = pGVar10;
        psVar9 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_308);
        *(string **)(field + 0x88) = psVar9;
        bVar2 = FieldDescriptorProto::has_default_value
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
        if (bVar2) {
          pTVar17 = this->tables_;
          psVar9 = FieldDescriptorProto::default_value_abi_cxx11_
                             ((FieldDescriptorProto *)extendee.field_1.descriptor);
          psVar9 = DescriptorPool::Tables::AllocateString(pTVar17,psVar9);
          *(string **)(field + 0x90) = psVar9;
        }
        FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
        bVar2 = FieldDescriptor::is_extension(field);
        if (bVar2) {
          DescriptorPool::Tables::AddExtension(this->tables_,field);
        }
        std::__cxx11::string::~string((string *)local_308);
        return;
      }
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      psVar15 = FieldDescriptorProto::type_name_abi_cxx11_
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
      AddNotDefinedError(this,psVar9,(Message *)aVar1.descriptor,TYPE,psVar15);
      return;
    }
    bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)extendee.field_1.descriptor);
    if (!bVar2) {
      if (local_2b0._0_4_ == MESSAGE) {
        *(undefined4 *)(field + 0x48) = 0xb;
      }
      else {
        if (local_2b0._0_4_ != ENUM) {
          psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
          aVar1 = extendee.field_1;
          psVar15 = FieldDescriptorProto::type_name_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.field_1.descriptor);
          std::operator+(&local_348,"\"",psVar15);
          std::operator+(&local_328,&local_348,"\" is not a type.");
          AddError(this,psVar9,(Message *)aVar1.descriptor,TYPE,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          std::__cxx11::string::~string((string *)&local_348);
          return;
        }
        *(undefined4 *)(field + 0x48) = 0xe;
      }
    }
    CVar5 = FieldDescriptor::cpp_type(field);
    if (CVar5 == CPPTYPE_MESSAGE) {
      if (local_2b0._0_4_ != MESSAGE) {
        psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
        aVar1 = extendee.field_1;
        psVar15 = FieldDescriptorProto::type_name_abi_cxx11_
                            ((FieldDescriptorProto *)extendee.field_1.descriptor);
        std::operator+(&local_388,"\"",psVar15);
        std::operator+(&local_368,&local_388,"\" is not a message type.");
        AddError(this,psVar9,(Message *)aVar1.descriptor,TYPE,&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        std::__cxx11::string::~string((string *)&local_388);
        return;
      }
      *(undefined8 *)(field + 0x70) = type._0_8_;
      bVar2 = FieldDescriptor::has_default_value(field);
      if (bVar2) {
        psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
        AddError(this,psVar9,(Message *)extendee.field_1.descriptor,DEFAULT_VALUE,
                 "Messages can\'t have default values.");
      }
    }
    else {
      CVar5 = FieldDescriptor::cpp_type(field);
      if (CVar5 == CPPTYPE_ENUM) {
        if (local_2b0._0_4_ != ENUM) {
          psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
          aVar1 = extendee.field_1;
          psVar15 = FieldDescriptorProto::type_name_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.field_1.descriptor);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &default_value.field_1,"\"",psVar15);
          std::operator+(&local_3a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &default_value.field_1,"\" is not an enum type.");
          AddError(this,psVar9,(Message *)aVar1.descriptor,TYPE,&local_3a8);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&default_value.field_1);
          return;
        }
        *(undefined8 *)(field + 0x78) = type._0_8_;
        pEVar11 = FieldDescriptor::enum_type(field);
        if (((byte)pEVar11[0x28] & 1) != 0) {
          field[0x98] = (FieldDescriptor)0x0;
        }
        bVar2 = FieldDescriptor::has_default_value(field);
        if (bVar2) {
          psVar9 = FieldDescriptorProto::default_value_abi_cxx11_
                             ((FieldDescriptorProto *)extendee.field_1.descriptor);
          bVar2 = io::Tokenizer::IsIdentifier(psVar9);
          if (bVar2) {
            psVar9 = FieldDescriptorProto::default_value_abi_cxx11_
                               ((FieldDescriptorProto *)extendee.field_1.descriptor);
            pEVar11 = FieldDescriptor::enum_type(field);
            psVar15 = EnumDescriptor::full_name_abi_cxx11_(pEVar11);
            SVar16 = LookupSymbolNoPlaceholder(this,psVar9,psVar15,LOOKUP_ALL,true);
            default_value._0_8_ = SVar16.field_1;
            local_3d8 = SVar16.type;
            if (local_3d8 == ENUM_VALUE) {
              pEVar11 = EnumValueDescriptor::type((EnumValueDescriptor *)default_value._0_8_);
              pEVar12 = FieldDescriptor::enum_type(field);
              if (pEVar11 == pEVar12) {
                *(undefined8 *)(field + 0xa0) = default_value._0_8_;
                goto LAB_004e7bc0;
              }
            }
            psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
            aVar1 = extendee.field_1;
            pEVar11 = FieldDescriptor::enum_type(field);
            psVar15 = EnumDescriptor::full_name_abi_cxx11_(pEVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &conflicting_field,"Enum type \"",psVar15);
            std::operator+(&local_438,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &conflicting_field,"\" has no value named \"");
            psVar15 = FieldDescriptorProto::default_value_abi_cxx11_
                                ((FieldDescriptorProto *)extendee.field_1.descriptor);
            std::operator+(&local_418,&local_438,psVar15);
            std::operator+(&local_3f8,&local_418,"\".");
            AddError(this,psVar9,(Message *)aVar1.descriptor,DEFAULT_VALUE,&local_3f8);
            std::__cxx11::string::~string((string *)&local_3f8);
            std::__cxx11::string::~string((string *)&local_418);
            std::__cxx11::string::~string((string *)&local_438);
            std::__cxx11::string::~string((string *)&conflicting_field);
          }
          else {
            psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
            AddError(this,psVar9,(Message *)extendee.field_1.descriptor,DEFAULT_VALUE,
                     "Default value for an enum field must be an identifier.");
          }
        }
        else {
          pEVar11 = FieldDescriptor::enum_type(field);
          iVar6 = EnumDescriptor::value_count(pEVar11);
          if (0 < iVar6) {
            pEVar11 = FieldDescriptor::enum_type(field);
            pEVar13 = EnumDescriptor::value(pEVar11,0);
            *(EnumValueDescriptor **)(field + 0xa0) = pEVar13;
          }
        }
      }
      else {
        psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
        AddError(this,psVar9,(Message *)extendee.field_1.descriptor,TYPE,
                 "Field with primitive type has type_name.");
      }
    }
  }
  else {
    CVar5 = FieldDescriptor::cpp_type(field);
    if ((CVar5 == CPPTYPE_MESSAGE) ||
       (CVar5 = FieldDescriptor::cpp_type(field), CVar5 == CPPTYPE_ENUM)) {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddError(this,psVar9,(Message *)extendee.field_1.descriptor,TYPE,
               "Field with message or enum type missing type_name.");
    }
  }
LAB_004e7bc0:
  bVar2 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (bVar2) {
    bVar2 = FieldDescriptor::is_extension(field);
    if ((bVar2) && (bVar2 = DescriptorPool::Tables::AddExtension(this->tables_,field), !bVar2)) {
      pTVar17 = this->tables_;
      pDVar14 = FieldDescriptor::containing_type(field);
      iVar6 = FieldDescriptor::number(field);
      error_msg.field_2._8_8_ = DescriptorPool::Tables::FindExtension(pTVar17,pDVar14,iVar6);
      iVar6 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_8e0,iVar6);
      pDVar14 = FieldDescriptor::containing_type(field);
      psVar9 = Descriptor::full_name_abi_cxx11_(pDVar14);
      strings::internal::SubstituteArg::SubstituteArg(&local_910,psVar9);
      psVar9 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)error_msg.field_2._8_8_);
      strings::internal::SubstituteArg::SubstituteArg(&local_940,psVar9);
      this_01 = FieldDescriptor::file((FieldDescriptor *)error_msg.field_2._8_8_);
      psVar9 = FileDescriptor::name_abi_cxx11_(this_01);
      strings::internal::SubstituteArg::SubstituteArg(&local_970,psVar9);
      strings::internal::SubstituteArg::SubstituteArg(&local_9a0);
      strings::internal::SubstituteArg::SubstituteArg(&local_9d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_a00);
      strings::internal::SubstituteArg::SubstituteArg(&local_a30);
      strings::internal::SubstituteArg::SubstituteArg(&local_a60);
      strings::internal::SubstituteArg::SubstituteArg(&local_a90);
      strings::Substitute_abi_cxx11_
                ((string *)local_8b0,
                 (strings *)
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3."
                 ,(char *)&local_8e0,&local_910,&local_940,&local_970,&local_9a0,&local_9d0,
                 &local_a00,&local_a30,&local_a60,&local_a90,(SubstituteArg *)pTVar17);
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddWarning(this,psVar9,(Message *)extendee.field_1.descriptor,NUMBER,(string *)local_8b0);
      std::__cxx11::string::~string((string *)local_8b0);
    }
  }
  else {
    this_00 = this->file_tables_;
    pDVar14 = FieldDescriptor::containing_type(field);
    iVar6 = FieldDescriptor::number(field);
    containing_type_name.field_2._8_8_ =
         FileDescriptorTables::FindFieldByNumber(this_00,pDVar14,iVar6);
    pDVar14 = FieldDescriptor::containing_type(field);
    local_482 = 0;
    if (pDVar14 == (Descriptor *)0x0) {
      std::allocator<char>::allocator();
      local_482 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_480,"unknown",&local_481);
    }
    else {
      pDVar14 = FieldDescriptor::containing_type(field);
      psVar9 = Descriptor::full_name_abi_cxx11_(pDVar14);
      std::__cxx11::string::string((string *)local_480,(string *)psVar9);
    }
    if ((local_482 & 1) != 0) {
      std::allocator<char>::~allocator(&local_481);
    }
    bVar2 = FieldDescriptor::is_extension(field);
    if (bVar2) {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      iVar6 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_4d8,iVar6);
      strings::internal::SubstituteArg::SubstituteArg(&local_508,(string *)local_480);
      psVar15 = FieldDescriptor::full_name_abi_cxx11_
                          ((FieldDescriptor *)containing_type_name.field_2._8_8_);
      strings::internal::SubstituteArg::SubstituteArg(&local_538,psVar15);
      strings::internal::SubstituteArg::SubstituteArg(&local_568);
      strings::internal::SubstituteArg::SubstituteArg(&local_598);
      strings::internal::SubstituteArg::SubstituteArg(&local_5c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_5f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_628);
      strings::internal::SubstituteArg::SubstituteArg(&local_658);
      strings::internal::SubstituteArg::SubstituteArg(&local_688);
      strings::Substitute_abi_cxx11_
                (&local_4a8,
                 (strings *)
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                 (char *)&local_4d8,&local_508,&local_538,&local_568,&local_598,&local_5c8,
                 &local_5f8,&local_628,&local_658,&local_688,in_stack_fffffffffffff318);
      AddError(this,psVar9,(Message *)aVar1.descriptor,NUMBER,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
    }
    else {
      psVar9 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      iVar6 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_6d8,iVar6);
      strings::internal::SubstituteArg::SubstituteArg(&local_708,(string *)local_480);
      psVar15 = FieldDescriptor::name_abi_cxx11_
                          ((FieldDescriptor *)containing_type_name.field_2._8_8_);
      strings::internal::SubstituteArg::SubstituteArg(&local_738,psVar15);
      strings::internal::SubstituteArg::SubstituteArg(&local_768);
      strings::internal::SubstituteArg::SubstituteArg(&local_798);
      strings::internal::SubstituteArg::SubstituteArg(&local_7c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_7f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_828);
      strings::internal::SubstituteArg::SubstituteArg(&local_858);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&conflicting_field_1);
      strings::Substitute_abi_cxx11_
                (&local_6a8,
                 (strings *)"Field number $0 has already been used in \"$1\" by field \"$2\".",
                 (char *)&local_6d8,&local_708,&local_738,&local_768,&local_798,&local_7c8,
                 &local_7f8,&local_828,&local_858,(SubstituteArg *)&conflicting_field_1,
                 in_stack_fffffffffffff318);
      AddError(this,psVar9,(Message *)aVar1.descriptor,NUMBER,&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
    }
    std::__cxx11::string::~string((string *)local_480);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->options_ == NULL) {
    field->options_ = &FieldOptions::default_instance();
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);

  if (proto.has_extendee()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor;

    const Descriptor::ExtensionRange* extension_range = field->containing_type()
        ->FindExtensionRangeContainingNumber(field->number());

    if (extension_range == NULL) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("\"$0\" does not declare $1 as an "
                                   "extension number.",
                                   field->containing_type()->full_name(),
                                   field->number()));
    }
  }

  if (field->containing_oneof() != NULL) {
    if (field->label() != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !pool_->lazily_build_dependencies_);

    // If the type is a weak type, we change the type to a google.protobuf.Empty field.
    if (type.IsNull() && !pool_->enforce_weak_ && proto.options().weak()) {
      type = FindSymbol(kNonLinkedWeakMessageReplacementName);
    }

    if (type.IsNull()) {
      if (pool_->lazily_build_dependencies_) {
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        string name = proto.type_name();
        if (!pool_->enforce_weak_ && proto.options().weak()) {
          name = kNonLinkedWeakMessageReplacementName;
        }
        field->type_once_ = tables_->AllocateOnceDynamic();
        field->type_name_ = tables_->AllocateString(name);
        if (proto.has_default_value()) {
          field->default_value_enum_name_ =
              tables_->AllocateString(proto.default_value());
        }
        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        AddNotDefinedError(field->full_name(), proto,
                           DescriptorPool::ErrorCollector::TYPE,
                           proto.type_name());
        return;
      }
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (type.type != Symbol::MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }
      field->message_type_ = type.descriptor;

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      if (type.type != Symbol::ENUM) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }
      field->enum_type_ = type.enum_descriptor;

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          Symbol default_value =
            LookupSymbolNoPlaceholder(proto.default_value(),
                                      field->enum_type()->full_name());

          if (default_value.type == Symbol::ENUM_VALUE &&
              default_value.enum_value_descriptor->type() ==
              field->enum_type()) {
            field->default_value_enum_ = default_value.enum_value_descriptor;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Enum type \"" + field->enum_type()->full_name() +
                     "\" has no value named \"" + proto.default_value() +
                     "\".");
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field =
      file_tables_->FindFieldByNumber(field->containing_type(),
                                      field->number());
    string containing_type_name = field->containing_type() == NULL
                                      ? "unknown"
                                      : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                   "in \"$1\" by extension \"$2\".",
                                   field->number(),
                                   containing_type_name,
                                   conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                   "\"$1\" by field \"$2\".",
                                   field->number(),
                                   containing_type_name,
                                   conflicting_field->name()));
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        const FieldDescriptor* conflicting_field =
            tables_->FindExtension(field->containing_type(), field->number());
        string error_msg = strings::Substitute(
            "Extension number $0 has already been used in \"$1\" by extension "
            "\"$2\" defined in $3.",
            field->number(),
            field->containing_type()->full_name(),
            conflicting_field->full_name(),
            conflicting_field->file()->name());
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO(xiaofeng): Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, error_msg);
      }
    }
  }
}